

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void am_script_remove_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object match_command;
  Am_Object execute_script_command;
  Am_Object script_window;
  Am_Object cmd_for_menu_bar;
  Am_Object window;
  Am_Object sel_widget;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Get_Object(&local_48,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&local_40,(Am_Slot_Key)&local_48,10);
  Am_Object::~Am_Object(&local_48);
  pAVar2 = Am_Object::Get(&local_40,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&local_48,pAVar2);
  pAVar2 = Am_Object::Get(&local_48,Am_SHOW_SCRIPT_COMMAND,3);
  Am_Object::Am_Object(&local_38,pAVar2);
  bVar1 = Am_Object::Valid(&local_38);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_40,Am_UNDO_MENU_OF_COMMANDS,0);
    Am_Object::Am_Object(&local_50,pAVar2);
    pAVar2 = Am_Object::Get(&local_50,0x197,0);
    Am_Object::Am_Object(&local_10,pAVar2);
    pAVar2 = Am_Object::Get(&local_10,0x68,0);
    Am_Object::Am_Object(&local_18,pAVar2);
    remove_show_script_command(&local_48,&local_38,&local_50);
    Am_Object::Am_Object(&local_20,&local_48);
    Am_Object::Am_Object(&local_28,&local_18);
    Am_Remove_Accelerator_Command_From_Window(&local_20,&local_28);
    Am_Object::~Am_Object(&local_28);
    Am_Object::~Am_Object(&local_20);
    Am_Object::~Am_Object(&local_18);
    Am_Object::~Am_Object(&local_10);
    Am_Object::~Am_Object(&local_50);
  }
  pAVar2 = Am_Object::Get(&local_48,Am_BEFORE_OR_AFTER_COMMAND,3);
  Am_Object::Am_Object(&local_50,pAVar2);
  bVar1 = Am_Object::Valid(&local_50);
  if (bVar1) {
    am_remove_match_command(&local_50);
  }
  Am_Object::Am_Object(&local_30,&local_40);
  done_with_script_window(&local_30);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_40);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_script_remove, (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object execute_script_command =
      script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Object cmd_for_menu_bar = execute_script_command.Get(
      Am_SHOW_SCRIPT_COMMAND, Am_RETURN_ZERO_ON_ERROR);
  if (cmd_for_menu_bar.Valid()) { //then was registered
    // SPACE LEAK, should probably destroy Am_COMMANDS_IN_SCRIPT and/or
    // Am_COMMANDS_PROTOTYPES

    Am_Object undo_db = script_window.Get(Am_UNDO_MENU_OF_COMMANDS);
    Am_Object sel_widget = undo_db.Get(Am_SELECTION_WIDGET);
    Am_Object window = sel_widget.Get(Am_WINDOW);
    remove_show_script_command(execute_script_command, cmd_for_menu_bar,
                               undo_db);
    Am_Remove_Accelerator_Command_From_Window(execute_script_command, window);
  }
  Am_Object match_command = execute_script_command.Get(
      Am_BEFORE_OR_AFTER_COMMAND, Am_RETURN_ZERO_ON_ERROR);
  if (match_command.Valid())
    am_remove_match_command(match_command);

  done_with_script_window(script_window);
}